

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointcheckpointscheme.c
# Opt level: O2

SUNErrCode
SUNAdjointCheckpointScheme_InsertVector
          (SUNAdjointCheckpointScheme_conflict self,suncountertype step_num,suncountertype stage_num
          ,sunrealtype t,N_Vector state)

{
  SUNAdjointCheckpointSchemeInsertVectorFn UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = self->ops->insertvector;
  if (UNRECOVERED_JUMPTABLE != (SUNAdjointCheckpointSchemeInsertVectorFn)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(self,step_num,stage_num,t,state);
    return SVar1;
  }
  return -0x2701;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_InsertVector(SUNAdjointCheckpointScheme self,
                                                   suncountertype step_num,
                                                   suncountertype stage_num,
                                                   sunrealtype t, N_Vector state)
{
  SUNFunctionBegin(self->sunctx);
  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);
  if (self->ops->insertvector)
  {
    SUNErrCode err = self->ops->insertvector(self, step_num, stage_num, t, state);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }
  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}